

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void PushStyleCompact(void)

{
  ImGuiStyle *style;
  ImVec2 *in_stack_00000018;
  ImGuiStyleVar in_stack_00000024;
  ImVec2 IStack_18;
  ImVec2 local_10;
  ImGuiStyle *local_8;
  
  local_8 = ImGui::GetStyle();
  ImVec2::ImVec2(&local_10,(local_8->FramePadding).x,(float)(int)((local_8->FramePadding).y * 0.6));
  ImGui::PushStyleVar(in_stack_00000024,in_stack_00000018);
  ImVec2::ImVec2(&IStack_18,(local_8->ItemSpacing).x,(float)(int)((local_8->ItemSpacing).y * 0.6));
  ImGui::PushStyleVar(in_stack_00000024,in_stack_00000018);
  return;
}

Assistant:

static void PushStyleCompact()
{
    ImGuiStyle& style = ImGui::GetStyle();
    ImGui::PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2(style.FramePadding.x, (float)(int)(style.FramePadding.y * 0.60f)));
    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x, (float)(int)(style.ItemSpacing.y * 0.60f)));
}